

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryTTF
          (ImFontAtlas *this,void *font_data,int font_data_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  ImFont *pIVar1;
  ImFontConfig local_b8;
  
  if (font_cfg_template == (ImFontConfig *)0x0) {
    memset(&local_b8.FontDataSize,0,0x88);
    local_b8.FontDataOwnedByAtlas = true;
    local_b8.OversampleH = 2;
    local_b8.OversampleV = 1;
    local_b8.GlyphMaxAdvanceX = 3.4028235e+38;
    local_b8.RasterizerMultiply = 1.0;
    local_b8.RasterizerDensity = 1.0;
    local_b8.EllipsisChar = 0xffff;
    local_b8.SizePixels = 0.0;
  }
  else {
    memcpy(&local_b8,font_cfg_template,0x90);
  }
  local_b8.SizePixels =
       (float)(~-(uint)(0.0 < size_pixels) & (uint)local_b8.SizePixels |
              (uint)size_pixels & -(uint)(0.0 < size_pixels));
  if (glyph_ranges != (ImWchar *)0x0) {
    local_b8.GlyphRanges = glyph_ranges;
  }
  local_b8.FontData = font_data;
  local_b8.FontDataSize = font_data_size;
  pIVar1 = AddFont(this,&local_b8);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryTTF(void* font_data, int font_data_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    IM_ASSERT(font_data_size > 100 && "Incorrect value for font_data_size!"); // Heuristic to prevent accidentally passing a wrong value to font_data_size.
    font_cfg.FontData = font_data;
    font_cfg.FontDataSize = font_data_size;
    font_cfg.SizePixels = size_pixels > 0.0f ? size_pixels : font_cfg.SizePixels;
    if (glyph_ranges)
        font_cfg.GlyphRanges = glyph_ranges;
    return AddFont(&font_cfg);
}